

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerragenLoader.cpp
# Opt level: O3

void __thiscall
Assimp::TerragenImporter::InternReadFile
          (TerragenImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int8_t **ppiVar1;
  uint uVar2;
  int8_t *piVar3;
  char cVar4;
  short sVar5;
  short sVar6;
  ushort uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  undefined4 extraout_var;
  aiNode *this_00;
  aiMesh **ppaVar11;
  aiMesh *paVar12;
  ulong *puVar13;
  aiVector3D *__s;
  aiVector3D *__s_00;
  Logger *this_01;
  uint *puVar14;
  long *plVar15;
  runtime_error *prVar16;
  aiFace *paVar17;
  long lVar18;
  long *plVar19;
  aiFace *paVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  float fVar24;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  StreamReaderLE reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  float local_fc;
  uint local_f8;
  float local_f4;
  aiMesh *local_f0;
  ulong local_e8;
  aiVector3D **local_e0;
  float local_d4;
  float local_d0;
  float local_cc;
  StreamReader<false,_false> local_c8;
  TerragenImporter *local_90;
  undefined8 local_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  aiScene *local_78;
  aiNode *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  ppiVar1 = &local_c8.buffer;
  local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)ppiVar1;
  local_90 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"rb","");
  iVar8 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     local_c8.stream.
                     super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)ppiVar1) {
    operator_delete(local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr);
  }
  if ((IOStream *)CONCAT44(extraout_var,iVar8) == (IOStream *)0x0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_120,"Failed to open TERRAGEN TERRAIN file ",pFile);
    plVar15 = (long *)std::__cxx11::string::append((char *)&local_120);
    local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)*plVar15;
    plVar19 = plVar15 + 2;
    if (local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)plVar19) {
      local_c8.buffer = (int8_t *)*plVar19;
      local_c8.current = (int8_t *)plVar15[3];
      local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)ppiVar1;
    }
    else {
      local_c8.buffer = (int8_t *)*plVar19;
    }
    local_c8.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar15[1];
    *plVar15 = (long)plVar19;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    std::runtime_error::runtime_error(prVar16,(string *)&local_c8);
    *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  StreamReader<false,_false>::StreamReader(&local_c8,(IOStream *)CONCAT44(extraout_var,iVar8),false)
  ;
  piVar3 = local_c8.current;
  if (((int)local_c8.end - (int)local_c8.current & 0xfffffff0U) == 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: file is too small","");
    std::runtime_error::runtime_error(prVar16,(string *)&local_120);
    *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = strncmp(local_c8.current,"TERRAGEN",8);
  if (iVar8 != 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: Magic string \'TERRAGEN\' not found","");
    std::runtime_error::runtime_error(prVar16,(string *)&local_120);
    *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar8 = strncmp(piVar3 + 8,"TERRAIN ",8);
  if (iVar8 != 0) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: Magic string \'TERRAIN\' not found","");
    std::runtime_error::runtime_error(prVar16,(string *)&local_120);
    *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  (this_00->mName).length = 0x12;
  builtin_strncpy((this_00->mName).data,"<TERRAGEN.TERRAIN>",0x13);
  (this_00->mTransformation).c3 = 30.0;
  (this_00->mTransformation).b2 = 30.0;
  (this_00->mTransformation).a1 = 30.0;
  StreamReader<false,_false>::IncPtr(&local_c8,0x10);
  if (((int)local_c8.end - (int)local_c8.current & 0xfffffffcU) != 0) {
    uVar9 = 0;
    uVar2 = 0;
    do {
      piVar3 = local_c8.current;
      StreamReader<false,_false>::IncPtr(&local_c8,4);
      iVar8 = strncmp(piVar3,"EOF ",4);
      if (iVar8 == 0) break;
      iVar8 = strncmp(piVar3,"XPTS",4);
      if (iVar8 == 0) {
        uVar7 = StreamReader<false,_false>::Get<short>(&local_c8);
        uVar9 = (uint)uVar7;
      }
      else {
        iVar8 = strncmp(piVar3,"YPTS",4);
        if (iVar8 == 0) {
          uVar7 = StreamReader<false,_false>::Get<short>(&local_c8);
          uVar2 = (uint)uVar7;
        }
        else {
          iVar8 = strncmp(piVar3,"SIZE",4);
          if (iVar8 == 0) {
            uVar7 = StreamReader<false,_false>::Get<short>(&local_c8);
            uVar9 = uVar7 + 1;
            uVar2 = uVar9;
          }
          else {
            iVar8 = strncmp(piVar3,"SCAL",4);
            if (iVar8 == 0) {
              fVar24 = StreamReader<false,_false>::Get<float>(&local_c8);
              (this_00->mTransformation).a1 = fVar24;
              fVar24 = StreamReader<false,_false>::Get<float>(&local_c8);
              (this_00->mTransformation).b2 = fVar24;
              fVar24 = StreamReader<false,_false>::Get<float>(&local_c8);
              (this_00->mTransformation).c3 = fVar24;
            }
            else {
              iVar8 = strncmp(piVar3,"CRAD",4);
              if (iVar8 == 0) {
                StreamReader<false,_false>::Get<float>(&local_c8);
              }
              else {
                iVar8 = strncmp(piVar3,"CRVM",4);
                if (iVar8 == 0) {
                  cVar4 = StreamReader<false,_false>::Get<signed_char>(&local_c8);
                  if (cVar4 != '\0') {
                    this_01 = DefaultLogger::get();
                    Logger::error(this_01,
                                  "TER: Unsupported mapping mode, a flat terrain is returned");
                  }
                }
                else {
                  iVar8 = strncmp(piVar3,"ALTW",4);
                  if (iVar8 == 0) {
                    sVar5 = StreamReader<false,_false>::Get<short>(&local_c8);
                    sVar6 = StreamReader<false,_false>::Get<short>(&local_c8);
                    piVar3 = local_c8.current;
                    if ((uint)((int)local_c8.end - (int)local_c8.current) < uVar2 * uVar9 * 2) {
                      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_120,"TER: ALTW chunk is too small","");
                      std::runtime_error::runtime_error(prVar16,(string *)&local_120);
                      *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
                      __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_88 = CONCAT44(extraout_XMM0_Db,(float)(int)sVar5 * 1.5258789e-05);
                    if ((uVar9 < 2) || (uVar2 < 2)) {
                      prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
                      local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_120,"TER: Invalid terrain size","");
                      std::runtime_error::runtime_error(prVar16,(string *)&local_120);
                      *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
                      __cxa_throw(prVar16,&DeadlyImportError::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    pScene->mNumMeshes = 1;
                    uStack_80 = extraout_XMM0_Dc;
                    uStack_7c = extraout_XMM0_Dd;
                    ppaVar11 = (aiMesh **)operator_new__(8);
                    pScene->mMeshes = ppaVar11;
                    local_78 = pScene;
                    local_70 = this_00;
                    paVar12 = (aiMesh *)operator_new(0x520);
                    paVar12->mPrimitiveTypes = 0;
                    paVar12->mNumVertices = 0;
                    local_e0 = &paVar12->mVertices;
                    memset(local_e0,0,0xcc);
                    paVar12->mBones = (aiBone **)0x0;
                    paVar12->mMaterialIndex = 0;
                    (paVar12->mName).length = 0;
                    (paVar12->mName).data[0] = '\0';
                    memset((paVar12->mName).data + 1,0x1b,0x3ff);
                    paVar12->mNumAnimMeshes = 0;
                    paVar12->mAnimMeshes = (aiAnimMesh **)0x0;
                    paVar12->mMethod = 0;
                    (paVar12->mAABB).mMin.x = 0.0;
                    (paVar12->mAABB).mMin.y = 0.0;
                    (paVar12->mAABB).mMin.z = 0.0;
                    (paVar12->mAABB).mMax.x = 0.0;
                    (paVar12->mAABB).mMax.y = 0.0;
                    (paVar12->mAABB).mMax.z = 0.0;
                    memset(paVar12->mColors,0,0xa0);
                    *ppaVar11 = paVar12;
                    local_f8 = uVar9 - 1;
                    local_e8 = CONCAT44(local_e8._4_4_,uVar2 - 1);
                    uVar21 = local_f8 * (uVar2 - 1);
                    uVar23 = (ulong)uVar21;
                    paVar12->mNumFaces = uVar21;
                    local_f0 = paVar12;
                    puVar13 = (ulong *)operator_new__(uVar23 * 0x10 + 8);
                    local_cc = (float)(int)sVar6;
                    local_48 = (float)(~-(uint)((float)local_88 != 0.0) & 0x3f800000 |
                                      (uint)(float)local_88 & -(uint)((float)local_88 != 0.0));
                    uStack_44 = local_88._4_4_;
                    uStack_40 = uStack_80;
                    uStack_3c = uStack_7c;
                    *puVar13 = uVar23;
                    paVar20 = (aiFace *)(puVar13 + 1);
                    paVar17 = paVar20;
                    do {
                      paVar17->mNumIndices = 0;
                      paVar17->mIndices = (uint *)0x0;
                      paVar17 = paVar17 + 1;
                    } while (paVar17 != (aiFace *)(puVar13 + uVar23 * 2 + 1));
                    local_f0->mFaces = paVar20;
                    uVar22 = uVar21 * 4;
                    local_f0->mNumVertices = uVar22;
                    uVar23 = (ulong)uVar22 * 0xc;
                    __s = (aiVector3D *)operator_new__(uVar23);
                    if ((uVar21 & 0x3fffffff) != 0) {
                      memset(__s,0,((uVar23 - 0xc) / 0xc) * 0xc + 0xc);
                    }
                    *local_e0 = __s;
                    if (local_90->configComputeUVs == true) {
                      __s_00 = (aiVector3D *)operator_new__(uVar23);
                      if (uVar22 != 0) {
                        memset(__s_00,0,((uVar23 - 0xc) / 0xc) * 0xc + 0xc);
                      }
                      local_f0->mTextureCoords[0] = __s_00;
                      local_fc = 1.0 / (float)uVar2;
                      local_f4 = 1.0 / (float)uVar9;
                    }
                    else {
                      local_fc = 0.0;
                      __s_00 = (aiVector3D *)0x0;
                      local_f4 = 0.0;
                    }
                    if ((int)local_e8 != 0) {
                      local_68 = (ulong)uVar9;
                      local_60 = local_e8 & 0xffffffff;
                      local_50 = (ulong)local_f8;
                      uVar23 = 0;
                      iVar8 = 0;
                      do {
                        if (local_f8 == 0) {
                          uVar23 = uVar23 + 1;
                        }
                        else {
                          local_d4 = (float)(int)uVar23;
                          local_88 = uVar23 * local_68;
                          local_e0 = (aiVector3D **)CONCAT44(local_e0._4_4_,local_d4 + 1.0);
                          local_58 = uVar23 + 1;
                          local_e8 = local_58 * local_68;
                          local_f0 = (aiMesh *)CONCAT44(local_f0._4_4_,local_d4);
                          local_d4 = local_fc * local_d4;
                          local_d0 = (float)(int)local_58 * local_fc;
                          uVar23 = 0;
                          do {
                            iVar10 = iVar8;
                            fVar24 = (float)(int)uVar23;
                            sVar5 = *(short *)(piVar3 + (local_88 + uVar23) * 2);
                            __s->x = fVar24;
                            __s->y = local_f0._0_4_;
                            __s->z = (float)(int)sVar5 * local_48 + local_cc;
                            sVar5 = *(short *)(piVar3 + (uVar23 + local_e8) * 2);
                            __s[1].x = fVar24;
                            __s[1].y = local_e0._0_4_;
                            __s[1].z = (float)(int)sVar5 * local_48 + local_cc;
                            sVar5 = *(short *)(piVar3 + (uVar23 + local_e8) * 2 + 2);
                            __s[2].x = fVar24 + 1.0;
                            __s[2].y = local_e0._0_4_;
                            __s[2].z = (float)(int)sVar5 * local_48 + local_cc;
                            sVar5 = *(short *)(piVar3 + (local_88 + uVar23) * 2 + 2);
                            __s[3].x = fVar24 + 1.0;
                            __s[3].y = local_f0._0_4_;
                            __s[3].z = (float)(int)sVar5 * local_48 + local_cc;
                            if (local_90->configComputeUVs == true) {
                              __s_00->x = fVar24 * local_f4;
                              __s_00->y = local_d4;
                              __s_00->z = 0.0;
                              __s_00[1].x = fVar24 * local_f4;
                              __s_00[1].y = local_d0;
                              __s_00[1].z = 0.0;
                              fVar24 = (float)((int)uVar23 + 1) * local_f4;
                              __s_00[2].x = fVar24;
                              __s_00[2].y = local_d0;
                              __s_00[2].z = 0.0;
                              __s_00[3].x = fVar24;
                              __s_00[3].y = local_d4;
                              __s_00[3].z = 0.0;
                              __s_00 = __s_00 + 4;
                            }
                            paVar20->mNumIndices = 4;
                            puVar14 = (uint *)operator_new__(0x10);
                            __s = __s + 4;
                            paVar20->mIndices = puVar14;
                            lVar18 = 0;
                            do {
                              paVar20->mIndices[lVar18] = iVar10 + (int)lVar18;
                              lVar18 = lVar18 + 1;
                            } while (lVar18 != 4);
                            uVar23 = uVar23 + 1;
                            paVar20 = paVar20 + 1;
                            iVar8 = iVar10 + 4;
                          } while (uVar23 != local_50);
                          iVar8 = iVar10 + 4;
                          uVar23 = local_58;
                        }
                      } while (uVar23 != local_60);
                    }
                    this_00 = local_70;
                    local_70->mNumMeshes = 1;
                    puVar14 = (uint *)operator_new__(4);
                    this_00->mMeshes = puVar14;
                    *puVar14 = 0;
                    pScene = local_78;
                  }
                }
              }
            }
          }
        }
      }
      uVar21 = (int)local_c8.current - (int)local_c8.buffer & 3;
      if (uVar21 != 0) {
        StreamReader<false,_false>::IncPtr(&local_c8,(ulong)(4 - uVar21));
      }
    } while (((int)local_c8.end - (int)local_c8.current & 0xfffffffcU) != 0);
  }
  if (pScene->mNumMeshes != 1) {
    prVar16 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"TER: Unable to load terrain","");
    std::runtime_error::runtime_error(prVar16,(string *)&local_120);
    *(undefined ***)prVar16 = &PTR__runtime_error_008dc448;
    __cxa_throw(prVar16,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 0x10;
  StreamReader<false,_false>::~StreamReader(&local_c8);
  return;
}

Assistant:

void TerragenImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    IOStream* file = pIOHandler->Open( pFile, "rb");

    // Check whether we can read from the file
    if( file == NULL)
        throw DeadlyImportError( "Failed to open TERRAGEN TERRAIN file " + pFile + ".");

    // Construct a stream reader to read all data in the correct endianness
    StreamReaderLE reader(file);
    if(reader.GetRemainingSize() < 16)
        throw DeadlyImportError( "TER: file is too small" );

    // Check for the existence of the two magic strings 'TERRAGEN' and 'TERRAIN '
    if (::strncmp((const char*)reader.GetPtr(),AI_TERR_BASE_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAGEN\' not found" );

    if (::strncmp((const char*)reader.GetPtr()+8,AI_TERR_TERRAIN_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAIN\' not found" );

    unsigned int x = 0,y = 0,mode = 0;

    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<TERRAGEN.TERRAIN>");

    // Default scaling is 30
    root->mTransformation.a1 = root->mTransformation.b2 = root->mTransformation.c3 = 30.f;

    // Now read all chunks until we're finished or an EOF marker is encountered
    reader.IncPtr(16);
    while (reader.GetRemainingSize() >= 4)
    {
        const char* head = (const char*)reader.GetPtr();
        reader.IncPtr(4);

        // EOF, break in every case
        if (!::strncmp(head,AI_TERR_EOF_STRING,4))
            break;

        // Number of x-data points
        if (!::strncmp(head,AI_TERR_CHUNK_XPTS,4))
        {
            x = (uint16_t)reader.GetI2();
        }
        // Number of y-data points
        else if (!::strncmp(head,AI_TERR_CHUNK_YPTS,4))
        {
            y = (uint16_t)reader.GetI2();
        }
        // Squared terrains width-1.
        else if (!::strncmp(head,AI_TERR_CHUNK_SIZE,4))
        {
            x = y = (uint16_t)reader.GetI2()+1;
        }
        // terrain scaling
        else if (!::strncmp(head,AI_TERR_CHUNK_SCAL,4))
        {
            root->mTransformation.a1 = reader.GetF4();
            root->mTransformation.b2 = reader.GetF4();
            root->mTransformation.c3 = reader.GetF4();
        }
        // mapping == 1: earth radius
        else if (!::strncmp(head,AI_TERR_CHUNK_CRAD,4))
        {
            reader.GetF4();
        }
        // mapping mode
        else if (!::strncmp(head,AI_TERR_CHUNK_CRVM,4))
        {
            mode = reader.GetI1();
            if (0 != mode)
                ASSIMP_LOG_ERROR("TER: Unsupported mapping mode, a flat terrain is returned");
        }
        // actual terrain data
        else if (!::strncmp(head,AI_TERR_CHUNK_ALTW,4))
        {
            float hscale  = (float)reader.GetI2()  / 65536;
            float bheight = (float)reader.GetI2();

            if (!hscale)hscale = 1;

            // Ensure we have enough data
            if (reader.GetRemainingSize() < x*y*2)
                throw DeadlyImportError("TER: ALTW chunk is too small");

            if (x <= 1 || y <= 1)
                throw DeadlyImportError("TER: Invalid terrain size");

            // Allocate the output mesh
            pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 1];
            aiMesh* m = pScene->mMeshes[0] = new aiMesh();

            // We return quads
            aiFace* f = m->mFaces = new aiFace[m->mNumFaces = (x-1)*(y-1)];
            aiVector3D* pv = m->mVertices = new aiVector3D[m->mNumVertices = m->mNumFaces*4];

            aiVector3D *uv( NULL );
            float step_y( 0.0f ), step_x( 0.0f );
            if (configComputeUVs) {
                uv = m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
                step_y = 1.f/y;
                step_x = 1.f/x;
            }
            const int16_t* data = (const int16_t*)reader.GetPtr();

            for (unsigned int yy = 0, t = 0; yy < y-1;++yy) {
                for (unsigned int xx = 0; xx < x-1;++xx,++f)    {

                    // make verts
                    const float fy = (float)yy, fx = (float)xx;
                    unsigned tmp,tmp2;
                    *pv++ = aiVector3D(fx,fy,    (float)data[(tmp2=x*yy)    + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx,fy+1,  (float)data[(tmp=x*(yy+1)) + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy+1,(float)data[tmp  + xx+1]         * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy,  (float)data[tmp2 + xx+1]         * hscale + bheight);

                    // also make texture coordinates, if necessary
                    if (configComputeUVs) {
                        *uv++ = aiVector3D( step_x*xx,     step_y*yy,     0.f );
                        *uv++ = aiVector3D( step_x*xx,     step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*yy,     0.f );
                    }

                    // make indices
                    f->mIndices = new unsigned int[f->mNumIndices = 4];
                    for (unsigned int i = 0; i < 4;++i)
                        f->mIndices[i] = t++;
                }
            }

            // Add the mesh to the root node
            root->mMeshes = new unsigned int[root->mNumMeshes = 1];
            root->mMeshes[0] = 0;
        }

        // Get to the next chunk (4 byte aligned)
        unsigned dtt;
        if ((dtt = reader.GetCurrentPos() & 0x3))
            reader.IncPtr(4-dtt);
    }

    // Check whether we have a mesh now
    if (pScene->mNumMeshes != 1)
        throw DeadlyImportError("TER: Unable to load terrain");

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;
}